

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::DeepTiledOutputFile::DeepTiledOutputFile(DeepTiledOutputFile *this,OutputPartData *part)

{
  bool bVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  long in_RSI;
  GenericOutputFile *in_RDI;
  stringstream _iex_replace_s;
  DeepTiledOutputFile *in_stack_00000050;
  BaseExc *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe8c;
  Data *in_stack_fffffffffffffe90;
  
  GenericOutputFile::GenericOutputFile(in_RDI);
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__DeepTiledOutputFile_004e8a30;
  Header::type_abi_cxx11_((Header *)0x1a55f9);
  bVar1 = std::operator!=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if (!bVar1) {
    pp_Var3 = (_func_int **)operator_new(0x1d0);
    Data::Data(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    in_RDI[1]._vptr_GenericOutputFile = pp_Var3;
    in_RDI[1]._vptr_GenericOutputFile[0x38] = *(_func_int **)(in_RSI + 0x58);
    *(undefined1 *)(in_RDI[1]._vptr_GenericOutputFile + 0x39) = 0;
    initialize(in_stack_00000050,__iex_replace_s);
    *(undefined4 *)(in_RDI[1]._vptr_GenericOutputFile + 0x33) = *(undefined4 *)(in_RSI + 0x4c);
    in_RDI[1]._vptr_GenericOutputFile[0x2a] = *(_func_int **)(in_RSI + 0x38);
    in_RDI[1]._vptr_GenericOutputFile[0x17] = *(_func_int **)(in_RSI + 0x40);
    *(byte *)((long)in_RDI[1]._vptr_GenericOutputFile + 0x3c) = *(byte *)(in_RSI + 0x50) & 1;
    return;
  }
  uVar2 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
  __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

DeepTiledOutputFile::DeepTiledOutputFile (const OutputPartData* part)
{

    try
    {
        if (part->header.type () != DEEPTILE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a DeepTiledOutputFile from "
                "a type-mismatched part.");

        _data                = new Data (part->numThreads);
        _data->_streamData   = part->mutex;
        _data->_deleteStream = false;
        initialize (part->header);
        _data->partNumber          = part->partNumber;
        _data->tileOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition     = part->previewPosition;
        _data->multipart           = part->multipart;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        if (_data) delete _data;

        REPLACE_EXC (
            e,
            "Cannot initialize output part "
            "\"" << part->partNumber
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        if (_data) delete _data;

        throw;
    }
}